

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

char * crnlib::get_dxt_compressor_name(crn_dxt_compressor_type c)

{
  char *pcStack_10;
  crn_dxt_compressor_type c_local;
  
  if (c == cCRNDXTCompressorCRN) {
    pcStack_10 = "CRN";
  }
  else if (c == cCRNDXTCompressorCRNF) {
    pcStack_10 = "CRNF";
  }
  else if (c == cCRNDXTCompressorRYG) {
    pcStack_10 = "RYG";
  }
  else {
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* get_dxt_compressor_name(crn_dxt_compressor_type c)
    {
        switch (c)
        {
        case cCRNDXTCompressorCRN:
            return "CRN";
        case cCRNDXTCompressorCRNF:
            return "CRNF";
        case cCRNDXTCompressorRYG:
            return "RYG";
#if CRNLIB_SUPPORT_ATI_COMPRESS
        case cCRNDXTCompressorATI:
            return "ATI";
#endif
        default:
            break;
        }
        CRNLIB_ASSERT(false);
        return "?";
    }